

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,Address *out_align)

{
  Location loc;
  bool bVar1;
  Result result;
  size_type sVar2;
  const_pointer pvVar3;
  ParseIntType in_R8D;
  undefined8 in_R9;
  string_view v;
  undefined1 local_70 [8];
  string_view sv;
  Token token;
  Address *out_align_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,AlignEqNat,0);
  if (bVar1) {
    Consume((Token *)&sv._M_str,this);
    _local_70 = Token::text((Token *)&sv._M_str);
    v._M_str = (char *)out_align;
    v._M_len = sv._M_len;
    result = ParseInt64((wabt *)local_70,v,(uint64_t *)0x0,in_R8D);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
      loc.filename._M_str = (char *)token.loc.filename._M_len;
      loc.filename._M_len = (size_t)sv._M_str;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename._M_str;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid alignment \"%.*s\"",sVar2 & 0xffffffff,pvVar3,
            token.loc.filename._M_str,in_R9);
    }
    bVar1 = anon_unknown_1::IsPowerOfTwo((uint32_t)*out_align);
    if (!bVar1) {
      Error(this,0x257704);
    }
    this_local._7_1_ = true;
  }
  else {
    *out_align = 0xffffffffffffffff;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseAlignOpt(Address* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    std::string_view sv = token.text();
    if (Failed(ParseInt64(sv, out_align, ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}